

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Recorder.cpp
# Opt level: O2

void __thiscall
helics::apps::Recorder::addDestEndpointClone(Recorder *this,string_view destEndpoint)

{
  CloningFilter *pCVar1;
  Endpoint *pEVar2;
  _Head_base<0UL,_helics::Endpoint_*,_false> _Var3;
  string *psVar4;
  Interface *this_00;
  string_view endpoint;
  _Head_base<0UL,_helics::Endpoint_*,_false> local_30;
  element_type *local_28;
  
  this_00 = (Interface *)
            (this->cFilt)._M_t.
            super___uniq_ptr_impl<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>
            ._M_t.
            super__Tuple_impl<0UL,_helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_>
            .super__Head_base<0UL,_helics::CloningFilter_*,_false>._M_head_impl;
  if (this_00 == (Interface *)0x0) {
    local_28 = (this->super_App).fed.
               super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::make_unique<helics::CloningFilter,helics::CombinationFederate*>
              ((CombinationFederate **)&local_30);
    _Var3._M_head_impl = local_30._M_head_impl;
    local_30._M_head_impl = (Endpoint *)0x0;
    pCVar1 = (this->cFilt)._M_t.
             super___uniq_ptr_impl<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_>
             .super__Head_base<0UL,_helics::CloningFilter_*,_false>._M_head_impl;
    (this->cFilt)._M_t.
    super___uniq_ptr_impl<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>._M_t.
    super__Tuple_impl<0UL,_helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_>.
    super__Head_base<0UL,_helics::CloningFilter_*,_false>._M_head_impl =
         (CloningFilter *)_Var3._M_head_impl;
    if (pCVar1 != (CloningFilter *)0x0) {
      (**(code **)(*(long *)&(pCVar1->super_Filter).super_Interface + 8))();
      if (local_30._M_head_impl != (Endpoint *)0x0) {
        (*((local_30._M_head_impl)->super_Interface)._vptr_Interface[1])();
      }
    }
    local_28 = (this->super_App).fed.
               super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::make_unique<helics::Endpoint,helics::CombinationFederate*,char_const(&)[7]>
              ((CombinationFederate **)&local_30,(char (*) [7])&local_28);
    _Var3._M_head_impl = local_30._M_head_impl;
    local_30._M_head_impl = (Endpoint *)0x0;
    pEVar2 = (this->cloneEndpoint)._M_t.
             super___uniq_ptr_impl<helics::Endpoint,_std::default_delete<helics::Endpoint>_>._M_t.
             super__Tuple_impl<0UL,_helics::Endpoint_*,_std::default_delete<helics::Endpoint>_>.
             super__Head_base<0UL,_helics::Endpoint_*,_false>._M_head_impl;
    (this->cloneEndpoint)._M_t.
    super___uniq_ptr_impl<helics::Endpoint,_std::default_delete<helics::Endpoint>_>._M_t.
    super__Tuple_impl<0UL,_helics::Endpoint_*,_std::default_delete<helics::Endpoint>_>.
    super__Head_base<0UL,_helics::Endpoint_*,_false>._M_head_impl = _Var3._M_head_impl;
    if (pEVar2 != (Endpoint *)0x0) {
      (**(code **)((long)(pEVar2->super_Interface)._vptr_Interface + 8))();
      if (local_30._M_head_impl != (Endpoint *)0x0) {
        (*(((Filter *)&(local_30._M_head_impl)->super_Interface)->super_Interface)._vptr_Interface
          [1])();
      }
    }
    pCVar1 = (this->cFilt)._M_t.
             super___uniq_ptr_impl<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>
             ._M_t.
             super__Tuple_impl<0UL,_helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_>
             .super__Head_base<0UL,_helics::CloningFilter_*,_false>._M_head_impl;
    psVar4 = Interface::getName_abi_cxx11_
                       (&((this->cloneEndpoint)._M_t.
                          super___uniq_ptr_impl<helics::Endpoint,_std::default_delete<helics::Endpoint>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_helics::Endpoint_*,_std::default_delete<helics::Endpoint>_>
                          .super__Head_base<0UL,_helics::Endpoint_*,_false>._M_head_impl)->
                         super_Interface);
    endpoint._M_str = (psVar4->_M_dataplus)._M_p;
    endpoint._M_len = psVar4->_M_string_length;
    CloningFilter::addDeliveryEndpoint(pCVar1,endpoint);
    this_00 = (Interface *)
              (this->cFilt)._M_t.
              super___uniq_ptr_impl<helics::CloningFilter,_std::default_delete<helics::CloningFilter>_>
              ._M_t.
              super__Tuple_impl<0UL,_helics::CloningFilter_*,_std::default_delete<helics::CloningFilter>_>
              .super__Head_base<0UL,_helics::CloningFilter_*,_false>._M_head_impl;
  }
  Interface::addDestinationTarget(this_00,(string_view)destEndpoint,UNKNOWN);
  return;
}

Assistant:

void Recorder::addDestEndpointClone(std::string_view destEndpoint)
{
    if (!cFilt) {
        cFilt = std::make_unique<CloningFilter>(fed.get());
        cloneEndpoint = std::make_unique<Endpoint>(fed.get(), "cloneE");
        cFilt->addDeliveryEndpoint(cloneEndpoint->getName());
    }
    cFilt->addDestinationTarget(destEndpoint);
}